

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_ldm_getTableSize(ldmParams_t params)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(params.hashLog - params.bucketSizeLog);
  if (params.hashLog < params.bucketSizeLog) {
    uVar2 = 0;
  }
  sVar1 = 0;
  if (params.enableLdm == ZSTD_ps_enable) {
    sVar1 = (8L << ((byte)params.hashLog & 0x3f)) + (1L << ((byte)uVar2 & 0x3f));
  }
  return sVar1;
}

Assistant:

size_t ZSTD_ldm_getTableSize(ldmParams_t params)
{
    size_t const ldmHSize = ((size_t)1) << params.hashLog;
    size_t const ldmBucketSizeLog = MIN(params.bucketSizeLog, params.hashLog);
    size_t const ldmBucketSize = ((size_t)1) << (params.hashLog - ldmBucketSizeLog);
    size_t const totalSize = ZSTD_cwksp_alloc_size(ldmBucketSize)
                           + ZSTD_cwksp_alloc_size(ldmHSize * sizeof(ldmEntry_t));
    return params.enableLdm == ZSTD_ps_enable ? totalSize : 0;
}